

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 jx9MemObjToNumeric(jx9_value *pObj)

{
  sxu32 nLen;
  uint uVar1;
  sxi32 sVar2;
  sxi64 sVar3;
  char **in_RCX;
  bool bVar4;
  sxu8 bReal;
  sxu8 local_29;
  SyString local_28;
  
  uVar1 = pObj->iFlags;
  if ((uVar1 & 0x2e) == 0) {
    if ((uVar1 & 1) == 0) {
      if ((uVar1 & 0x140) != 0) {
        sVar2 = jx9MemObjToInteger(pObj);
        return sVar2;
      }
      sVar2 = jx9MemObjToReal(pObj);
      return sVar2;
    }
    local_29 = '\0';
    nLen = (pObj->sBlob).nByte;
    if (nLen == 0) {
      bVar4 = false;
    }
    else {
      sVar2 = SyStrIsNumeric((char *)(pObj->sBlob).pBlob,nLen,&local_29,in_RCX);
      bVar4 = sVar2 == 0;
    }
    if (local_29 == '\0') {
      if (bVar4) {
        local_28.zString = (char *)(pObj->sBlob).pBlob;
        local_28.nByte = nLen;
        sVar3 = jx9TokenValueToInt64(&local_28);
      }
      else {
        sVar3 = 0;
      }
      (pObj->x).iVal = sVar3;
      pObj->iFlags = pObj->iFlags & 0xfffffe90U | 2;
      uVar1 = SyBlobRelease(&pObj->sBlob);
    }
    else {
      uVar1 = jx9MemObjToReal(pObj);
    }
  }
  else if ((uVar1 & 0x28) != 0) {
    if ((uVar1 & 0x20) != 0) {
      (pObj->x).rVal = 0.0;
    }
    uVar1 = uVar1 & 0xfffffe90 | 2;
    pObj->iFlags = uVar1;
  }
  return uVar1;
}

Assistant:

JX9_PRIVATE sxi32 jx9MemObjToNumeric(jx9_value *pObj)
{
	if( pObj->iFlags & (MEMOBJ_INT|MEMOBJ_REAL|MEMOBJ_BOOL|MEMOBJ_NULL) ){
		if( pObj->iFlags & (MEMOBJ_BOOL|MEMOBJ_NULL) ){
			if( pObj->iFlags & MEMOBJ_NULL ){
				pObj->x.iVal = 0;
			}
			MemObjSetType(pObj, MEMOBJ_INT);
		}
		/* Already numeric */
		return  SXRET_OK;
	}
	if( pObj->iFlags & MEMOBJ_STRING ){
		sxi32 rc = SXERR_INVALID;
		sxu8 bReal = FALSE;
		SyString sString;
		SyStringInitFromBuf(&sString, SyBlobData(&pObj->sBlob), SyBlobLength(&pObj->sBlob));
		/* Check if the given string looks like a numeric number */
		if( sString.nByte > 0 ){
			rc = SyStrIsNumeric(sString.zString, sString.nByte, &bReal, 0);
		}
		if( bReal ){
			jx9MemObjToReal(&(*pObj));
		}else{
			if( rc != SXRET_OK ){
				/* The input does not look at all like a number, set the value to 0 */
				pObj->x.iVal = 0;
			}else{
				/* Convert as much as we can */
				pObj->x.iVal = MemObjStringToInt(&(*pObj));
			}
			MemObjSetType(pObj, MEMOBJ_INT);
			SyBlobRelease(&pObj->sBlob);
		}
	}else if(pObj->iFlags & (MEMOBJ_HASHMAP|MEMOBJ_RES)){
		jx9MemObjToInteger(pObj);
	}else{
		/* Perform a blind cast */
		jx9MemObjToReal(&(*pObj));
	}
	return SXRET_OK;
}